

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O2

ProducerBase * __thiscall
moodycamel::ConcurrentQueue<unsigned_int,_moodycamel::ConcurrentQueueDefaultTraits>::
recycle_or_create_producer
          (ConcurrentQueue<unsigned_int,_moodycamel::ConcurrentQueueDefaultTraits> *this,
          bool isExplicit,bool *recycled)

{
  atomic<bool> *paVar1;
  ConcurrentQueueProducerTypelessBase *pCVar2;
  ExplicitProducer *producer;
  ProducerBase *pPVar3;
  bool bVar4;
  ConcurrentQueue<unsigned_int,_moodycamel::ConcurrentQueueDefaultTraits> *local_10;
  
  pPVar3 = (this->producerListTail)._M_b._M_p;
  do {
    if (pPVar3 == (ProducerBase *)0x0) {
      *recycled = false;
      local_10 = this;
      if (isExplicit) {
        producer = ConcurrentQueue<unsigned_int,moodycamel::ConcurrentQueueDefaultTraits>::
                   create<moodycamel::ConcurrentQueue<unsigned_int,moodycamel::ConcurrentQueueDefaultTraits>::ExplicitProducer,moodycamel::ConcurrentQueue<unsigned_int,moodycamel::ConcurrentQueueDefaultTraits>*>
                             (&local_10);
      }
      else {
        producer = (ExplicitProducer *)
                   ConcurrentQueue<unsigned_int,moodycamel::ConcurrentQueueDefaultTraits>::
                   create<moodycamel::ConcurrentQueue<unsigned_int,moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducer,moodycamel::ConcurrentQueue<unsigned_int,moodycamel::ConcurrentQueueDefaultTraits>*>
                             (&local_10);
      }
      pPVar3 = add_producer(this,&producer->super_ProducerBase);
      return pPVar3;
    }
    if ((((pPVar3->super_ConcurrentQueueProducerTypelessBase).inactive._M_base._M_i & 1U) != 0) &&
       (pPVar3->isExplicit == isExplicit)) {
      paVar1 = &(pPVar3->super_ConcurrentQueueProducerTypelessBase).inactive;
      LOCK();
      bVar4 = (paVar1->_M_base)._M_i == true;
      if (bVar4) {
        (paVar1->_M_base)._M_i = false;
      }
      UNLOCK();
      if (bVar4) {
        *recycled = true;
        return pPVar3;
      }
    }
    pCVar2 = (pPVar3->super_ConcurrentQueueProducerTypelessBase).next;
    pPVar3 = (ProducerBase *)&pCVar2[-1].token;
    if (pCVar2 == (ConcurrentQueueProducerTypelessBase *)0x0) {
      pPVar3 = (ProducerBase *)0x0;
    }
  } while( true );
}

Assistant:

ProducerBase* recycle_or_create_producer(bool isExplicit, bool& recycled)
	{
#if MCDBGQ_NOLOCKFREE_IMPLICITPRODHASH
		debug::DebugLock lock(implicitProdMutex);
#endif
		// Try to re-use one first
		for (auto ptr = producerListTail.load(std::memory_order_acquire); ptr != nullptr; ptr = ptr->next_prod()) {
			if (ptr->inactive.load(std::memory_order_relaxed) && ptr->isExplicit == isExplicit) {
				bool expected = true;
				if (ptr->inactive.compare_exchange_strong(expected, /* desired */ false, std::memory_order_acquire, std::memory_order_relaxed)) {
					// We caught one! It's been marked as activated, the caller can have it
					recycled = true;
					return ptr;
				}
			}
		}
		
		recycled = false;
		return add_producer(isExplicit ? static_cast<ProducerBase*>(create<ExplicitProducer>(this)) : create<ImplicitProducer>(this));
	}